

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,
          longdouble kappa,longdouble delta,longdouble theta,longdouble objective_amplifier)

{
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  uint uVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  row_iterator prVar8;
  bit_array *x_00;
  ulong uVar9;
  rc_data *__first;
  long lVar10;
  rc_data *__last;
  long lVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar13;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_b8;
  uint local_b4;
  int local_b0;
  longdouble local_ac;
  bit_array *local_a0;
  solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
  *local_98;
  int *local_90;
  undefined8 local_88;
  int *local_80;
  undefined1 local_78 [16];
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_ac = objective_amplifier;
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  lVar13 = in_ST4;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    uVar7 = 0;
  }
  else {
    local_98 = this + 0x10;
    uVar7 = 0;
    local_a0 = x;
    local_90 = last._M_current;
    do {
      local_b8 = *first._M_current;
      if (*(int *)(this + 0x78) <= local_b8) {
        push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_88 = uVar7;
      local_80 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_78,(int)local_98);
      if (local_78._8_8_ != local_78._0_8_) {
        lVar11 = *(long *)(this + 0x50);
        prVar8 = (row_iterator)local_78._8_8_;
        do {
          lVar10 = (long)prVar8->value * 0x10;
          *(longdouble *)(lVar11 + lVar10) = *(longdouble *)(lVar11 + lVar10) * local_68;
          prVar8 = prVar8 + 1;
        } while (prVar8 != (row_iterator)local_78._0_8_);
      }
      x_00 = x;
      local_b4 = solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                             *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,x);
      uVar9 = (ulong)local_b4;
      if (local_b4 != 0) {
        lVar11 = 0;
        lVar12 = in_ST0;
        lVar2 = in_ST1;
        lVar3 = in_ST2;
        lVar4 = in_ST3;
        lVar5 = in_ST4;
        in_ST4 = lVar13;
        do {
          in_ST3 = lVar5;
          in_ST2 = lVar4;
          in_ST1 = lVar3;
          in_ST0 = lVar2;
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x70),
                     (quadratic_cost_type<long_double> *)
                     (ulong)*(uint *)(*(long *)(this + 0x58) + 0x10 + lVar11),(int)x,x_00);
          *(longdouble *)(*(long *)(this + 0x58) + lVar11) =
               *(longdouble *)(*(long *)(this + 0x58) + lVar11) + local_ac * lVar12;
          lVar11 = lVar11 + 0x20;
          lVar12 = in_ST0;
          lVar2 = in_ST1;
          lVar3 = in_ST2;
          lVar4 = in_ST3;
          lVar5 = in_ST4;
          lVar13 = in_ST4;
        } while (uVar9 << 5 != lVar11);
      }
      if (1 < (int)local_b4) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x58);
        lVar11 = (long)(int)local_b4;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar11,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar11);
        __last = __first + 1;
        lVar11 = lVar11 * 0x20 + -0x20;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar11 = lVar11 + -0x20;
        } while (lVar11 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      uVar1 = local_b4;
      local_b0 = solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                 ::select_variables((solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                                     *)this,local_b4,
                                    *(int *)(*(long *)(this + 0x60) + (long)local_b8 * 8),
                                    *(int *)(*(long *)(this + 0x60) + 4 + (long)local_b8 * 8));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_b8,
                 (int *)((long)local_b8 * 8 + *(long *)(this + 0x60)));
      if (0 < (int)uVar1) {
        lVar11 = 0;
        do {
          fmt_01._M_str = "({} {}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<long_double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (longdouble *)(*(long *)(this + 0x58) + lVar11),
                     (int *)(*(long *)(this + 0x58) + 0x10 + lVar11));
          lVar11 = lVar11 + 0x20;
        } while (uVar9 << 5 != lVar11);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x60) + 4 + (long)local_b8 * 8),&local_b0);
      x = local_a0;
      bVar6 = affect<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,local_a0,(row_value *)local_78._8_8_,local_b8,local_b0,local_b4,
                         local_48,local_58);
      uVar7 = CONCAT71((int7)((ulong)local_88 >> 8),(byte)local_88 | bVar6);
      first._M_current = local_80 + 1;
    } while (first._M_current != local_90);
  }
  return (bool)((byte)uVar7 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < r_size; ++i)
                logger::log("({} {}) ", R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }